

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O2

void r3d::clip<3>(Polytope<3> *poly,Plane<3> *planes,Int nplanes)

{
  double dVar1;
  uint onv;
  int iVar2;
  Real RVar3;
  ulong uVar4;
  Polytope<3> *pPVar5;
  ulong uVar6;
  long lVar7;
  UninitT *rhs;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  Int IVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Int clipped [128];
  Real sdists [128];
  Real local_6e8;
  Few<double,_3> local_6b0;
  Few<double,_3> local_698;
  Few<double,_3> local_680;
  Few<double,_3> local_668;
  Few<double,_3> local_650;
  int local_638 [128];
  double adStack_438 [129];
  
  if (0 < poly->nverts) {
    uVar8 = 0;
    uVar6 = (ulong)(uint)nplanes;
    if (nplanes < 1) {
      uVar6 = uVar8;
    }
    while( true ) {
      if (uVar8 == uVar6) break;
      onv = poly->nverts;
      memset(local_638,0,0x200);
      uVar4 = 0;
      if (0 < (int)onv) {
        uVar4 = (ulong)onv;
      }
      dVar12 = -1.79769313486232e+308;
      rhs = (UninitT *)&poly->verts[0].pos;
      dVar14 = 1.79769313486232e+308;
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        dVar1 = planes[uVar8].d;
        Few<double,_3>::Few(&local_680,(Few<double,_3> *)&rhs->__align);
        Few<double,_3>::Few(&local_698,(Few<double,_3> *)(planes + uVar8));
        RVar3 = operator*((Vector<3> *)&local_680,(Vector<3> *)&local_698);
        dVar1 = RVar3 + dVar1;
        adStack_438[uVar10] = dVar1;
        if (dVar1 < 0.0) {
          local_638[uVar10] = 1;
        }
        dVar13 = dVar1;
        if (dVar14 <= dVar1) {
          dVar13 = dVar14;
        }
        if (dVar1 <= dVar12) {
          dVar1 = dVar12;
        }
        dVar12 = dVar1;
        rhs = rhs + 5;
        dVar14 = dVar13;
      }
      if (dVar14 < 0.0) {
        if (dVar12 <= 0.0) {
          poly->nverts = 0;
          return;
        }
        pPVar5 = poly;
        for (uVar10 = 0; uVar10 != uVar4; uVar10 = uVar10 + 1) {
          if (local_638[uVar10] == 0) {
            for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
              iVar2 = pPVar5->verts[0].pnbrs[lVar9];
              if (local_638[iVar2] != 0) {
                poly->verts[poly->nverts].pnbrs[0] = (Int)uVar10;
                pPVar5->verts[0].pnbrs[lVar9] = poly->nverts;
                Few<double,_3>::Few(&local_6b0,&poly->verts[uVar10].pos.super_Few<double,_3>);
                local_6e8 = -adStack_438[iVar2];
                Few<double,_3>::Few(&local_668,&poly->verts[iVar2].pos.super_Few<double,_3>);
                wav<3>((Vector<3> *)&local_650,(Vector<3> *)&local_6b0,local_6e8,
                       (Vector<3> *)&local_668,adStack_438[uVar10]);
                Few<double,_3>::operator=
                          (&poly->verts[poly->nverts].pos.super_Few<double,_3>,&local_650);
                poly->nverts = poly->nverts + 1;
              }
            }
          }
          pPVar5 = (Polytope<3> *)(pPVar5->verts + 1);
        }
        ClipHelper<3>::finalize_links(onv,poly);
        IVar11 = 0;
        pPVar5 = poly;
        for (lVar9 = 0; lVar9 < poly->nverts; lVar9 = lVar9 + 1) {
          if (local_638[lVar9] == 0) {
            Vertex<3>::operator=(poly->verts + IVar11,pPVar5->verts);
            local_638[lVar9] = IVar11;
            IVar11 = IVar11 + 1;
          }
          pPVar5 = (Polytope<3> *)(pPVar5->verts + 1);
        }
        poly->nverts = IVar11;
        pPVar5 = poly;
        for (lVar9 = 0; lVar9 < IVar11; lVar9 = lVar9 + 1) {
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            pPVar5->verts[0].pnbrs[lVar7] = local_638[pPVar5->verts[0].pnbrs[lVar7]];
          }
          IVar11 = poly->nverts;
          pPVar5 = (Polytope<3> *)(pPVar5->verts + 1);
        }
      }
      uVar8 = uVar8 + 1;
    }
  }
  return;
}

Assistant:

R3D_INLINE void clip(
    Polytope<dim>& poly, Plane<dim> const* planes, Int nplanes) {
  if (poly.nverts <= 0) return;

  // variable declarations
  Int v, p, np, onv, vcur, vnext, numunclipped;

  // signed distances to the clipping plane
  Real sdists[Polytope<dim>::max_verts];
  Real smin, smax;

  // loop over each clip plane
  for (p = 0; p < nplanes; ++p) {
    // calculate signed distances to the clip plane
    onv = poly.nverts;
    smin = ArithTraits<Real>::max();
    smax = ArithTraits<Real>::min();

    // for marking clipped vertices
    Int clipped[MaxVerts<dim>::value] = {};  // all initialized to zero
    for (v = 0; v < onv; ++v) {
      sdists[v] = planes[p].d + (poly.verts[v].pos * planes[p].n);
      if (sdists[v] < smin) smin = sdists[v];
      if (sdists[v] > smax) smax = sdists[v];
      if (sdists[v] < 0.0) clipped[v] = 1;
    }

    // skip this face if the poly lies entirely on one side of it
    if (smin >= 0.0) continue;
    if (smax <= 0.0) {
      poly.nverts = 0;
      return;
    }

    // check all edges and insert new vertices on the bisected edges
    for (vcur = 0; vcur < onv; ++vcur) {
      if (clipped[vcur]) continue;
      for (np = 0; np < dim; ++np) {
        vnext = poly.verts[vcur].pnbrs[np];
        if (!clipped[vnext]) continue;
        ClipHelper<dim>::init_new_vert_link(poly, vcur, np);
        poly.verts[vcur].pnbrs[np] = poly.nverts;
        poly.verts[poly.nverts].pos = wav(poly.verts[vcur].pos, -sdists[vnext],
            poly.verts[vnext].pos, sdists[vcur]);
        ++(poly.nverts);
      }
    }

    // for each new vert, search around the poly for its new neighbors
    // and doubly-link everything
    ClipHelper<dim>::finalize_links(onv, poly);

    // go through and compress the vertex list, removing clipped verts
    // and re-indexing accordingly (reusing `clipped` to re-index everything)
    numunclipped = 0;
    for (v = 0; v < poly.nverts; ++v) {
      if (!clipped[v]) {
        poly.verts[numunclipped] = poly.verts[v];
        clipped[v] = numunclipped++;
      }
    }
    poly.nverts = numunclipped;
    for (v = 0; v < poly.nverts; ++v)
      for (np = 0; np < dim; ++np)
        poly.verts[v].pnbrs[np] = clipped[poly.verts[v].pnbrs[np]];
  }
}